

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_16n_coeff_contexts_ver
               (uint8_t *levels,int width,int height,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  ptrdiff_t *in_RCX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  int h;
  __m128i pos_to_offset;
  int col;
  __m128i level [5];
  __m128i count;
  __m128i pos_to_offset_large;
  int stride;
  int local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  int local_17c;
  longlong local_178 [10];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_fc;
  undefined8 *local_f8;
  ptrdiff_t *local_f0;
  int local_e8;
  uint8_t *local_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_f8 = (undefined8 *)CONCAT71(in_register_00000081,in_R8B);
  local_fc = in_EDX + 4;
  local_b9 = 0x24;
  local_ba = 0x24;
  local_bb = 0x24;
  local_bc = 0x24;
  local_bd = 0x24;
  local_be = 0x24;
  local_bf = 0x24;
  local_c0 = 0x24;
  local_c1 = 0x24;
  local_c2 = 0x24;
  local_c3 = 0x24;
  local_c4 = 0x24;
  local_c5 = 0x24;
  local_c6 = 0x24;
  local_c7 = 0x24;
  local_c8 = 0x24;
  local_59 = 0x24;
  local_5a = 0x24;
  local_5b = 0x24;
  local_5c = 0x24;
  local_5d = 0x24;
  local_5e = 0x24;
  local_5f = 0x24;
  local_60 = 0x24;
  local_61 = 0x24;
  local_62 = 0x24;
  local_63 = 0x24;
  local_64 = 0x24;
  local_65 = 0x24;
  local_66 = 0x24;
  local_67 = 0x24;
  local_68 = 0x24;
  local_118 = 0x2424242424242424;
  uStack_110 = 0x2424242424242424;
  local_17c = in_ESI;
  local_f0 = in_RCX;
  local_e8 = in_EDX;
  local_e0 = in_RDI;
  local_78 = local_118;
  uStack_70 = uStack_110;
  do {
    local_c9 = 0x1a;
    local_ca = 0x1f;
    local_cb = 0x24;
    local_cc = 0x24;
    local_cd = 0x24;
    local_ce = 0x24;
    local_cf = 0x24;
    local_d0 = 0x24;
    local_d1 = 0x24;
    local_d2 = 0x24;
    local_d3 = 0x24;
    local_d4 = 0x24;
    local_d5 = 0x24;
    local_d6 = 0x24;
    local_d7 = 0x24;
    local_d8 = 0x24;
    local_31 = 0x24;
    local_32 = 0x24;
    local_33 = 0x24;
    local_34 = 0x24;
    local_35 = 0x24;
    local_36 = 0x24;
    local_37 = 0x24;
    local_38 = 0x24;
    local_39 = 0x24;
    local_3a = 0x24;
    local_3b = 0x24;
    local_3c = 0x24;
    local_3d = 0x24;
    local_3e = 0x24;
    local_3f = 0x1f;
    local_40 = 0x1a;
    local_198 = 0x2424242424241f1a;
    uStack_190 = 0x2424242424242424;
    local_19c = local_e8;
    puVar3 = local_e0;
    local_58 = local_198;
    uStack_50 = uStack_190;
    do {
      local_e0 = puVar3;
      load_levels_16x1x5_sse2(local_e0,local_fc,local_f0,(__m128i *)local_178);
      get_coeff_contexts_kernel_sse2((__m128i *)local_178);
      uVar1 = local_198;
      uVar2 = uStack_190;
      local_a8 = (char)extraout_XMM0_Qa;
      cStack_a7 = (char)((ulong)extraout_XMM0_Qa >> 8);
      cStack_a6 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
      cStack_a5 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
      cStack_a4 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
      cStack_a3 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
      cStack_a2 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
      cStack_a1 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
      cStack_a0 = (char)extraout_XMM0_Qb;
      cStack_9f = (char)((ulong)extraout_XMM0_Qb >> 8);
      cStack_9e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
      cStack_9d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
      cStack_9c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
      cStack_9b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
      cStack_9a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
      cStack_99 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
      local_b8._0_1_ = (char)local_198;
      local_b8._1_1_ = (char)((ulong)local_198 >> 8);
      local_b8._2_1_ = (char)((ulong)local_198 >> 0x10);
      local_b8._3_1_ = (char)((ulong)local_198 >> 0x18);
      local_b8._4_1_ = (char)((ulong)local_198 >> 0x20);
      local_b8._5_1_ = (char)((ulong)local_198 >> 0x28);
      local_b8._6_1_ = (char)((ulong)local_198 >> 0x30);
      local_b8._7_1_ = (char)((ulong)local_198 >> 0x38);
      uStack_b0._0_1_ = (char)uStack_190;
      uStack_b0._1_1_ = (char)((ulong)uStack_190 >> 8);
      uStack_b0._2_1_ = (char)((ulong)uStack_190 >> 0x10);
      uStack_b0._3_1_ = (char)((ulong)uStack_190 >> 0x18);
      uStack_b0._4_1_ = (char)((ulong)uStack_190 >> 0x20);
      uStack_b0._5_1_ = (char)((ulong)uStack_190 >> 0x28);
      uStack_b0._6_1_ = (char)((ulong)uStack_190 >> 0x30);
      uStack_b0._7_1_ = (char)((ulong)uStack_190 >> 0x38);
      local_128 = CONCAT17(cStack_a1 + local_b8._7_1_,
                           CONCAT16(cStack_a2 + local_b8._6_1_,
                                    CONCAT15(cStack_a3 + local_b8._5_1_,
                                             CONCAT14(cStack_a4 + local_b8._4_1_,
                                                      CONCAT13(cStack_a5 + local_b8._3_1_,
                                                               CONCAT12(cStack_a6 + local_b8._2_1_,
                                                                        CONCAT11(cStack_a7 +
                                                                                 local_b8._1_1_,
                                                                                 local_a8 +
                                                                                 (char)local_b8)))))
                                   ));
      uStack_120 = CONCAT17(cStack_99 + uStack_b0._7_1_,
                            CONCAT16(cStack_9a + uStack_b0._6_1_,
                                     CONCAT15(cStack_9b + uStack_b0._5_1_,
                                              CONCAT14(cStack_9c + uStack_b0._4_1_,
                                                       CONCAT13(cStack_9d + uStack_b0._3_1_,
                                                                CONCAT12(cStack_9e + uStack_b0._2_1_
                                                                         ,CONCAT11(cStack_9f +
                                                                                   uStack_b0._1_1_,
                                                                                   cStack_a0 +
                                                                                   (char)uStack_b0))
                                                               )))));
      local_80 = local_f8;
      local_98 = local_128;
      uStack_90 = uStack_120;
      *local_f8 = local_128;
      local_f8[1] = uStack_120;
      local_198 = local_118;
      uStack_190 = uStack_110;
      local_f8 = local_f8 + 2;
      local_19c = local_19c + -0x10;
      puVar3 = local_e0 + 0x10;
      local_b8 = uVar1;
      uStack_b0 = uVar2;
    } while (local_19c != 0);
    local_e0 = local_e0 + 0x14;
    local_17c = local_17c + -1;
  } while (local_17c != 0);
  return;
}

Assistant:

static inline void get_16n_coeff_contexts_ver(const uint8_t *levels,
                                              const int width, const int height,
                                              const ptrdiff_t *const offsets,
                                              int8_t *coeff_contexts) {
  const int stride = height + TX_PAD_HOR;
  const __m128i pos_to_offset_large =
      _mm_setr_epi8(SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10);
  __m128i count;
  __m128i level[5];
  int col = width;

  assert(!(height % 16));

  do {
    __m128i pos_to_offset =
        _mm_setr_epi8(SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                      SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10);
    int h = height;

    do {
      load_levels_16x1x5_sse2(levels, stride, offsets, level);
      count = get_coeff_contexts_kernel_sse2(level);
      count = _mm_add_epi8(count, pos_to_offset);
      _mm_store_si128((__m128i *)coeff_contexts, count);
      pos_to_offset = pos_to_offset_large;
      levels += 16;
      coeff_contexts += 16;
      h -= 16;
    } while (h);

    levels += TX_PAD_HOR;
  } while (--col);
}